

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::removeRowRange(SPxLPBase<double> *this,int start,int end,int *perm)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  DataArray<int> *in_RDI;
  int i;
  DataArray<int> p;
  int i_1;
  int in_stack_ffffffffffffffb8;
  int iVar4;
  int in_stack_ffffffffffffffbc;
  DataArray<int> *in_stack_ffffffffffffffc0;
  DataArray<int> local_38;
  int local_1c;
  long local_18;
  int local_10;
  int local_c;
  
  if (in_RCX == 0) {
    local_1c = (in_EDX - in_ESI) + 1;
    local_10 = in_EDX;
    local_c = in_ESI;
    DataArray<int>::DataArray
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
               (Real)in_RDI);
    while (local_1c = local_1c + -1, -1 < local_1c) {
      iVar1 = local_c + local_1c;
      piVar3 = DataArray<int>::operator[](&local_38,local_1c);
      *piVar3 = iVar1;
    }
    piVar3 = DataArray<int>::get_ptr(&local_38);
    (**(code **)(*(long *)in_RDI + 0x98))(in_RDI,piVar3,(local_10 - local_c) + 1,0);
    DataArray<int>::~DataArray(in_RDI);
  }
  else {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      *(int *)(in_RCX + (long)iVar1 * 4) = iVar1;
    }
    for (; local_18 = in_RCX, iVar1 <= in_EDX; iVar1 = iVar1 + 1) {
      *(undefined4 *)(in_RCX + (long)iVar1 * 4) = 0xffffffff;
    }
    while (iVar4 = iVar1, iVar2 = nRows((SPxLPBase<double> *)0x202c7c), iVar1 < iVar2) {
      *(int *)(local_18 + (long)iVar4 * 4) = iVar4;
      iVar1 = iVar4 + 1;
    }
    (**(code **)(*(long *)in_RDI + 0x88))(in_RDI,local_18);
  }
  return;
}

Assistant:

virtual void removeRowRange(int start, int end, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         int i = end - start + 1;
         DataArray < int > p(i);

         while(--i >= 0)
            p[i] = start + i;

         removeRows(p.get_ptr(), end - start + 1);
         return;
      }

      int i;

      for(i = 0; i < start; ++i)
         perm[i] = i;

      for(; i <= end; ++i)
         perm[i] = -1;

      for(; i < nRows(); ++i)
         perm[i] = i;

      removeRows(perm);
   }